

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

int mpt_bitmap_set(uint8_t *base,size_t len,long pos)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -0x11;
  if ((-1 < pos) && (uVar2 = (ulong)pos >> 3, uVar2 < len)) {
    iVar1 = 0;
    if ((base[uVar2] >> ((uint)pos & 7) & 1) == 0) {
      base[uVar2] = (byte)(1 << ((byte)pos & 7)) | base[uVar2];
      return 1;
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_bitmap_set(uint8_t *base, size_t len, long pos)
{
	size_t off;
	
	if (pos < 0 || (off = pos / 8) >= len) {
		return MPT_ERROR(MissingBuffer);
	}
	pos = pos % 8;
	
	if (base[off] & 1<<pos) return 0;
	base[off] |= 1<<pos;
	
	return 1;
}